

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

bool __thiscall VWReaderHandler<false>::Double(VWReaderHandler<false> *this,double v)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Context<false> *in_RDI;
  double in_XMM0_Qa;
  
  iVar2 = (*in_RDI->current_state->_vptr_BaseState[2])
                    (CONCAT44((int)((ulong)in_XMM0_Qa >> 0x20),(float)in_XMM0_Qa));
  bVar1 = Context<false>::TransitionState(in_RDI,(BaseState<false> *)CONCAT44(extraout_var,iVar2));
  return bVar1;
}

Assistant:

bool Double(double v) { return ctx.TransitionState(ctx.current_state->Float(ctx, (float)v)); }